

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.cpp
# Opt level: O0

void * zmq_timers_new(void)

{
  timers_t *this;
  timers_t *timers;
  timers_t *local_28;
  
  this = (timers_t *)operator_new(0x78,(nothrow_t *)&std::nothrow);
  local_28 = (timers_t *)0x0;
  if (this != (timers_t *)0x0) {
    zmq::timers_t::timers_t(this);
    local_28 = this;
  }
  if (local_28 == (timers_t *)0x0) {
    fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmq.cpp"
            ,0x557);
    fflush(_stderr);
    zmq::zmq_abort((char *)0x1cdc36);
  }
  return local_28;
}

Assistant:

void *zmq_timers_new (void)
{
    zmq::timers_t *timers = new (std::nothrow) zmq::timers_t;
    alloc_assert (timers);
    return timers;
}